

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O3

void __thiscall
scheduler_tests::singlethreadedscheduler_ordered::test_method(singlethreadedscheduler_ordered *this)

{
  long lVar1;
  function<void_()> func;
  function<void_()> func_00;
  pointer ptVar2;
  ulong uVar3;
  thread *ptVar4;
  pointer ptVar5;
  undefined8 uVar6;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX_00;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX_01;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX_02;
  anon_class_8_1_0c04475b_for__M_head_impl *extraout_RDX_03;
  anon_class_8_1_0c04475b_for__M_head_impl *__args;
  thread *thread;
  pointer ptVar7;
  ulong __n;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  thread *ptVar13;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffffd28;
  undefined **ppuVar14;
  _Manager_type in_stack_fffffffffffffd38;
  _Invoker_type in_stack_fffffffffffffd40;
  char *local_2b8;
  char *local_2b0;
  undefined4 local_2a4;
  lazy_ostream local_2a0;
  undefined1 *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  ulong local_260;
  int *local_258;
  code *local_250;
  code *local_248;
  ulong local_240;
  int *local_238;
  code *local_230;
  code *local_228;
  int counter2;
  int counter1;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined4 *local_1f8;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined1 *local_1e0;
  undefined4 **local_1d8;
  int *local_1d0;
  undefined **local_1c8;
  undefined1 local_1c0;
  undefined1 *local_1b8;
  int **local_1b0;
  char *local_1a8;
  char *local_1a0;
  assertion_result local_198;
  SerialTaskRunner queue2;
  SerialTaskRunner queue1;
  CScheduler scheduler;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler(&scheduler);
  queue1.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&queue1.m_callbacks_pending;
  queue1.super_TaskRunnerInterface._vptr_TaskRunnerInterface =
       (_func_int **)&PTR__SerialTaskRunner_013bdcc8;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  iVar10 = 0;
  queue1.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue1.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  queue1.m_are_callbacks_running = false;
  queue2.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&queue2.m_callbacks_pending;
  ppuVar14 = &PTR__SerialTaskRunner_013bdcc8;
  queue2.super_TaskRunnerInterface._vptr_TaskRunnerInterface =
       (_func_int **)&PTR__SerialTaskRunner_013bdcc8;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  queue2.m_callbacks_mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  queue2.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  queue2.m_are_callbacks_running = false;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  queue2.m_scheduler = &scheduler;
  queue2.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev =
       queue2.m_callbacks_pending.
       super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  queue1.m_scheduler = &scheduler;
  queue1.m_callbacks_pending.
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev =
       queue1.m_callbacks_pending.
       super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,5);
  __args = extraout_RDX;
  do {
    ptVar7 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar6 = std::__throw_length_error("vector::_M_realloc_insert");
          boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
          queue2.super_TaskRunnerInterface._vptr_TaskRunnerInterface = (_func_int **)ppuVar14;
          std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
          ::_M_clear(&queue2.m_callbacks_pending.
                      super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    );
          queue1.super_TaskRunnerInterface._vptr_TaskRunnerInterface = (_func_int **)ppuVar14;
          std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
          ::_M_clear(&queue1.m_callbacks_pending.
                      super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    );
          CScheduler::~CScheduler(&scheduler);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            _Unwind_Resume(uVar6);
          }
        }
        goto LAB_0058c012;
      }
      uVar12 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar3 = uVar12 + (uVar12 == 0);
      __n = uVar3 + uVar12;
      if (0xffffffffffffffe < __n) {
        __n = 0xfffffffffffffff;
      }
      if (CARRY8(uVar3,uVar12)) {
        __n = 0xfffffffffffffff;
      }
      if (__n == 0) {
        ptVar4 = (thread *)0x0;
      }
      else {
        ptVar4 = __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&threads,__n,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,scheduler_tests::singlethreadedscheduler_ordered::test_method()::__2>
                ((allocator_type *)(ptVar4 + uVar12),&scheduler.m_service_thread,__args);
      ptVar13 = ptVar4;
      for (ptVar5 = ptVar2; ptVar5 != ptVar7; ptVar5 = ptVar5 + 1) {
        (ptVar13->_M_id)._M_thread = (ptVar5->_M_id)._M_thread;
        (ptVar5->_M_id)._M_thread = 0;
        ptVar13 = ptVar13 + 1;
      }
      __args = extraout_RDX_02;
      if (ptVar2 != (pointer)0x0) {
        operator_delete(ptVar2,(long)threads.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar2);
        __args = extraout_RDX_03;
      }
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar4 + __n;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar4;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,scheduler_tests::singlethreadedscheduler_ordered::test_method()::__2>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,&scheduler.m_service_thread,__args);
      __args = extraout_RDX_00;
      ptVar13 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar13 + 1;
    iVar10 = iVar10 + 1;
  } while (iVar10 != 5);
  uVar11 = 0;
  counter1 = 0;
  counter2 = 0;
  do {
    local_240 = (ulong)uVar11;
    local_238 = &counter1;
    local_228 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:153:23)>
                ::_M_invoke;
    local_230 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:153:23)>
                ::_M_manager;
    func.super__Function_base._M_functor._8_8_ = ppuVar14;
    func.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd28;
    func.super__Function_base._M_manager = in_stack_fffffffffffffd38;
    func._M_invoker = in_stack_fffffffffffffd40;
    SerialTaskRunner::insert(&queue1,func);
    if (local_230 != (code *)0x0) {
      (*local_230)(&local_240,&local_240,3);
    }
    local_260 = (ulong)uVar11;
    local_258 = &counter2;
    local_248 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:158:23)>
                ::_M_invoke;
    local_250 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp:158:23)>
                ::_M_manager;
    func_00.super__Function_base._M_functor._8_8_ = ppuVar14;
    func_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd28;
    func_00.super__Function_base._M_manager = in_stack_fffffffffffffd38;
    func_00._M_invoker = in_stack_fffffffffffffd40;
    SerialTaskRunner::insert(&queue2,func_00);
    if (local_250 != (code *)0x0) {
      (*local_250)(&local_260,&local_260,3);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  CScheduler::StopWhenDrained(&scheduler);
  ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar7 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar7 != ptVar2; ptVar7 = ptVar7 + 1) {
    if ((ptVar7->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xaa;
  file.m_begin = (iterator)&local_270;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_280,msg);
  local_2a0.m_empty = false;
  local_2a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_290 = boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_1f8 = &local_2a4;
  local_2a4 = 100;
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(counter1 == 100);
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1a0 = "";
  local_1b0 = &local_1d0;
  local_1d0 = &counter1;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_013ae248;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_1f8;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_013ae248;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,&local_2a0,1,2,REQUIRE,0xecbc25,(size_t)&local_1a8,0xaa,&local_1c8,"100",
             &local_1f0);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_2b0 = "";
  file_00.m_end = (iterator)0xab;
  file_00.m_begin = (iterator)&local_2b8;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffd38,msg_00);
  local_2a0.m_empty = false;
  local_2a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_290 = boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(counter2 == 100);
  local_2a4 = 100;
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1a0 = "";
  local_1d0 = &counter2;
  local_1c0 = 0;
  local_1c8 = &PTR__lazy_ostream_013ae248;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_1d0;
  local_1f8 = &local_2a4;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_013ae248;
  local_1e0 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,&local_2a0,1,2,REQUIRE,0xecbc2e,(size_t)&local_1a8,0xab,&local_1c8,"100",
             &local_1f0);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  queue2.super_TaskRunnerInterface._vptr_TaskRunnerInterface = (_func_int **)ppuVar14;
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&queue2.m_callbacks_pending.
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  queue1.super_TaskRunnerInterface._vptr_TaskRunnerInterface = (_func_int **)ppuVar14;
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&queue1.m_callbacks_pending.
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  CScheduler::~CScheduler(&scheduler);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0058c012:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(singlethreadedscheduler_ordered)
{
    CScheduler scheduler;

    // each queue should be well ordered with respect to itself but not other queues
    SerialTaskRunner queue1(scheduler);
    SerialTaskRunner queue2(scheduler);

    // create more threads than queues
    // if the queues only permit execution of one task at once then
    // the extra threads should effectively be doing nothing
    // if they don't we'll get out of order behaviour
    std::vector<std::thread> threads;
    threads.reserve(5);
    for (int i = 0; i < 5; ++i) {
        threads.emplace_back([&] { scheduler.serviceQueue(); });
    }

    // these are not atomic, if SerialTaskRunner prevents
    // parallel execution at the queue level no synchronization should be required here
    int counter1 = 0;
    int counter2 = 0;

    // just simply count up on each queue - if execution is properly ordered then
    // the callbacks should run in exactly the order in which they were enqueued
    for (int i = 0; i < 100; ++i) {
        queue1.insert([i, &counter1]() {
            bool expectation = i == counter1++;
            assert(expectation);
        });

        queue2.insert([i, &counter2]() {
            bool expectation = i == counter2++;
            assert(expectation);
        });
    }

    // finish up
    scheduler.StopWhenDrained();
    for (auto& thread: threads) {
        if (thread.joinable()) thread.join();
    }

    BOOST_CHECK_EQUAL(counter1, 100);
    BOOST_CHECK_EQUAL(counter2, 100);
}